

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeRepresentation.hpp
# Opt level: O2

double operator/(TimeRepresentation<count_time<9,_long>_> t1,
                TimeRepresentation<count_time<9,_long>_> t2)

{
  return ((double)(t1.internalTimeCode % 1000000000) * 1e-09 +
         (double)(t1.internalTimeCode / 1000000000)) /
         ((double)(t2.internalTimeCode % 1000000000) * 1e-09 +
         (double)(t2.internalTimeCode / 1000000000));
}

Assistant:

inline double
    operator/(TimeRepresentation<Tconv> t1, TimeRepresentation<Tconv> t2)
{
    return static_cast<double>(t1) / static_cast<double>(t2);
}